

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O2

bool __thiscall
CppJieba::HMMSegment::cut
          (HMMSegment *this,const_iterator begin,const_iterator end,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  words;
  string tmp;
  
  if ((this->super_SegmentBase)._isInited != false) {
    if (begin._M_current == end._M_current) {
      bVar1 = false;
    }
    else {
      words.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      words.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      words.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = cut(this,begin,end,&words);
      if (bVar1) {
        tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
        tmp._M_string_length = 0;
        tmp.field_2._M_local_buf[0] = '\0';
        uVar3 = 0;
        while( true ) {
          if ((ulong)(((long)words.
                             super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)words.
                            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= (ulong)uVar3)
          break;
          bVar2 = TransCode::encode(words.
                                    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar3,&tmp);
          if (bVar2) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(res,&tmp);
          }
          uVar3 = uVar3 + 1;
        }
        std::__cxx11::string::~string((string *)&tmp);
      }
      std::
      vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ::~vector(&words);
    }
    return bVar1;
  }
  __assert_fail("_getInitFlag()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/HMMSegment.hpp"
                ,0x5d,
                "virtual bool CppJieba::HMMSegment::cut(Unicode::const_iterator, Unicode::const_iterator, vector<string> &) const"
               );
}

Assistant:

virtual bool cut(Unicode::const_iterator begin, Unicode::const_iterator end, vector<string>& res)const
            {
				assert(_getInitFlag());
                if(begin == end)
                {
                    return false;
                }
                vector<Unicode> words;
                if(!cut(begin, end, words))
                {
                    return false;
                }
                string tmp;
                for(uint i = 0; i < words.size(); i++)
                {
                    if(TransCode::encode(words[i], tmp))
                    {
                        res.push_back(tmp);
                    }
                }
                return true;
            }